

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAcurv::VariablesQbSetSpeed(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  ChVectorRef local_c8;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_b0 [56];
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  
  local_78 = (this->m_rxx_dt).m_data[0];
  dStack_70 = (this->m_rxx_dt).m_data[1];
  dStack_68 = (this->m_rxx_dt).m_data[2];
  dStack_60 = (this->m_ryy_dt).m_data[0];
  dStack_58 = (this->m_ryy_dt).m_data[1];
  dStack_50 = (this->m_ryy_dt).m_data[2];
  dStack_48 = (this->m_rzz_dt).m_data[0];
  dStack_40 = (this->m_rzz_dt).m_data[1];
  dVar1 = (this->m_rzz_dt).m_data[2];
  ChVariables::Get_qb(&local_c8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_b0,&local_c8,0,3);
  ChVector<double>::operator=(&this->m_rxx_dt,local_b0);
  ChVariables::Get_qb(&local_c8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_b0,&local_c8,3,3);
  ChVector<double>::operator=(&this->m_ryy_dt,local_b0);
  ChVariables::Get_qb(&local_c8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_b0,&local_c8,6,3);
  ChVector<double>::operator=(&this->m_rzz_dt,local_b0);
  if ((step != 0.0) || (NAN(step))) {
    auVar3._0_24_ = *(undefined1 (*) [24])&this->m_rxx_dt;
    auVar3._24_24_ = *(undefined1 (*) [24])&this->m_ryy_dt;
    auVar3._48_8_ = (this->m_rzz_dt).m_data[0];
    auVar3._56_8_ = (this->m_rzz_dt).m_data[1];
    auVar4._8_8_ = dStack_70;
    auVar4._0_8_ = local_78;
    auVar4._16_8_ = dStack_68;
    auVar4._24_8_ = dStack_60;
    auVar4._32_8_ = dStack_58;
    auVar4._40_8_ = dStack_50;
    auVar4._48_8_ = dStack_48;
    auVar4._56_8_ = dStack_40;
    auVar3 = vsubpd_avx512f(auVar3,auVar4);
    auVar5._0_8_ = 1.0 / step;
    auVar5._8_8_ = 0;
    dVar2 = (this->m_rzz_dt).m_data[2];
    auVar4 = vbroadcastsd_avx512f(auVar5);
    auVar3 = vmulpd_avx512f(auVar4,auVar3);
    this->m_rxx_dtdt = (ChVector<double>)auVar3._0_24_;
    this->m_ryy_dtdt = (ChVector<double>)auVar3._24_24_;
    (this->m_rzz_dtdt).m_data[0] = (double)auVar3._48_8_;
    (this->m_rzz_dtdt).m_data[1] = (double)auVar3._56_8_;
    (this->m_rzz_dtdt).m_data[2] = auVar5._0_8_ * (dVar2 - dVar1);
  }
  return;
}

Assistant:

void ChNodeFEAcurv::VariablesQbSetSpeed(double step) {
    ChVector<> old_rxx_dt = m_rxx_dt;
    ChVector<> old_ryy_dt = m_ryy_dt;
    ChVector<> old_rzz_dt = m_rzz_dt;

    m_rxx_dt = m_variables->Get_qb().segment(0, 3);
    m_ryy_dt = m_variables->Get_qb().segment(3, 3);
    m_rzz_dt = m_variables->Get_qb().segment(6, 3);

    if (step) {
        m_rxx_dtdt = (m_rxx_dt - old_rxx_dt) / step;
        m_ryy_dtdt = (m_ryy_dt - old_ryy_dt) / step;
        m_rzz_dtdt = (m_rzz_dt - old_rzz_dt) / step;
    }
}